

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::QName::operator==(QName *this,QName *qname)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  
  pXVar3 = this->fLocalPart;
  if (this->fPrefix == (XMLCh *)0x0 && pXVar3 == (XMLCh *)0x0) {
    return qname->fPrefix == (XMLCh *)0x0 && qname->fLocalPart == (XMLCh *)0x0;
  }
  if (this->fURIId == 0) {
    pXVar3 = getRawName(this);
    pXVar4 = getRawName(qname);
    if (pXVar3 == pXVar4) {
      return true;
    }
    if (pXVar4 != (XMLCh *)0x0 && pXVar3 != (XMLCh *)0x0) {
      while (XVar1 = *pXVar3, XVar1 != L'\0') {
        pXVar3 = pXVar3 + 1;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        if (XVar1 != XVar2) {
          return false;
        }
      }
      goto LAB_00235e67;
    }
    if (pXVar3 != (XMLCh *)0x0) {
      if (*pXVar3 != L'\0' || pXVar4 == (XMLCh *)0x0) {
        return *pXVar3 == L'\0';
      }
      goto LAB_00235e67;
    }
  }
  else {
    if (this->fURIId != qname->fURIId) {
      return false;
    }
    pXVar4 = qname->fLocalPart;
    if (pXVar3 == pXVar4) {
      return true;
    }
    if (pXVar4 != (XMLCh *)0x0 && pXVar3 != (XMLCh *)0x0) {
      while (XVar1 = *pXVar3, XVar1 != L'\0') {
        pXVar3 = pXVar3 + 1;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        if (XVar1 != XVar2) {
          return false;
        }
      }
      goto LAB_00235e67;
    }
    if (pXVar3 != (XMLCh *)0x0) {
      if (*pXVar3 != L'\0' || pXVar4 == (XMLCh *)0x0) {
        return *pXVar3 == L'\0';
      }
      goto LAB_00235e67;
    }
  }
  if (pXVar4 == (XMLCh *)0x0) {
    return true;
  }
LAB_00235e67:
  return *pXVar4 == L'\0';
}

Assistant:

bool QName::operator==(const QName& qname) const
{
    // if we are an unitialized QName, check that the other is unitialized too
    if (!fLocalPart && !fPrefix)
        return !qname.fLocalPart && !qname.fPrefix;

    if (fURIId == 0) // null URI
        return (XMLString::equals(getRawName(),qname.getRawName()));

    return ((fURIId == qname.getURI()) &&
           (XMLString::equals(fLocalPart, qname.getLocalPart())));
}